

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_2104d2::StandardLevelComputer::GetNewRequiredStandard
          (StandardLevelComputer *this,cmMakefile *makefile,string *targetName,string *feature,
          cmValue currentLangStandardValue,string *newRequiredStandard,string *error)

{
  bool bVar1;
  StandardNeeded SVar2;
  string *psVar3;
  const_reference pvVar4;
  bool local_1f1;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1b8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1b0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1a8;
  cmAlphaNum local_1a0;
  cmAlphaNum local_170;
  undefined1 local_140 [8];
  string e;
  int local_114;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_110;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_108;
  int *local_100;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_f8;
  const_iterator existingLevelIter;
  cmAlphaNum local_d8;
  cmAlphaNum local_a8;
  string local_78;
  cmValue local_58;
  cmValue defaultStandard;
  cmValue existingStandard;
  StandardNeeded needed;
  string *newRequiredStandard_local;
  string *feature_local;
  string *targetName_local;
  cmMakefile *makefile_local;
  StandardLevelComputer *this_local;
  cmValue currentLangStandardValue_local;
  
  this_local = (StandardLevelComputer *)currentLangStandardValue.Value;
  bVar1 = cmValue::operator_cast_to_bool((cmValue *)&this_local);
  if (bVar1) {
    psVar3 = cmValue::operator*[abi_cxx11_((cmValue *)&this_local);
    std::__cxx11::string::operator=((string *)newRequiredStandard,(string *)psVar3);
  }
  else {
    std::__cxx11::string::clear();
  }
  SVar2 = HighestStandardNeeded(this,makefile,feature);
  defaultStandard.Value = &this_local->Language;
  bVar1 = cmValue::operator_cast_to_bool(&defaultStandard);
  if (!bVar1) {
    cmAlphaNum::cmAlphaNum(&local_a8,"CMAKE_");
    cmAlphaNum::cmAlphaNum(&local_d8,&this->Language);
    cmStrCat<char[18]>(&local_78,&local_a8,&local_d8,(char (*) [18])"_STANDARD_DEFAULT");
    local_58 = cmMakefile::GetDefinition(makefile,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    existingLevelIter._M_current = (int *)local_58.Value;
    bVar1 = cmNonempty(local_58);
    if (bVar1) {
      defaultStandard.Value = local_58.Value;
    }
  }
  local_f8._M_current = (int *)std::cend<std::vector<int,std::allocator<int>>>(&this->Levels);
  bVar1 = cmValue::operator_cast_to_bool(&defaultStandard);
  if (bVar1) {
    local_108._M_current = (int *)std::cbegin<std::vector<int,std::allocator<int>>>(&this->Levels);
    local_110._M_current = (int *)std::cend<std::vector<int,std::allocator<int>>>(&this->Levels);
    psVar3 = cmValue::operator*[abi_cxx11_(&defaultStandard);
    local_114 = ParseStd(psVar3);
    local_100 = (int *)std::
                       find<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>
                                 (local_108,local_110,&local_114);
    local_f8 = (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)local_100;
    e.field_2._8_8_ = std::cend<std::vector<int,std::allocator<int>>>(&this->Levels);
    bVar1 = __gnu_cxx::operator==
                      (&local_f8,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       ((long)&e.field_2 + 8));
    if (bVar1) {
      cmAlphaNum::cmAlphaNum(&local_170,"The ");
      cmAlphaNum::cmAlphaNum(&local_1a0,&this->Language);
      psVar3 = cmValue::operator*[abi_cxx11_(&defaultStandard);
      cmStrCat<char[31],std::__cxx11::string,char[32],std::__cxx11::string,char[3]>
                ((string *)local_140,&local_170,&local_1a0,
                 (char (*) [31])"_STANDARD property on target \"",targetName,
                 (char (*) [32])"\" contained an invalid value: \"",psVar3,(char (*) [3])0xc51e52);
      if (error == (string *)0x0) {
        cmMakefile::IssueMessage(makefile,FATAL_ERROR,(string *)local_140);
      }
      else {
        std::__cxx11::string::operator=((string *)error,(string *)local_140);
      }
      currentLangStandardValue_local.Value._7_1_ = 0;
      std::__cxx11::string::~string((string *)local_140);
      goto LAB_00283715;
    }
  }
  existingStandard.Value._0_4_ = SVar2.index;
  if ((int)existingStandard.Value != -1) {
    local_1a8._M_current = (int *)std::cend<std::vector<int,std::allocator<int>>>(&this->Levels);
    bVar1 = __gnu_cxx::operator==(&local_f8,&local_1a8);
    local_1f1 = true;
    if (!bVar1) {
      local_1b8._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->Levels);
      local_1b0 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                  ::operator+(&local_1b8,(long)(int)existingStandard.Value);
      local_1f1 = __gnu_cxx::operator<(&local_f8,&local_1b0);
    }
    if (local_1f1 != false) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->LevelsAsStrings,(long)(int)existingStandard.Value);
      std::__cxx11::string::operator=((string *)newRequiredStandard,(string *)pvVar4);
    }
  }
  currentLangStandardValue_local.Value._7_1_ = 1;
LAB_00283715:
  return (bool)(currentLangStandardValue_local.Value._7_1_ & 1);
}

Assistant:

bool GetNewRequiredStandard(cmMakefile* makefile,
                              std::string const& targetName,
                              const std::string& feature,
                              cmValue currentLangStandardValue,
                              std::string& newRequiredStandard,
                              std::string* error) const
  {
    if (currentLangStandardValue) {
      newRequiredStandard = *currentLangStandardValue;
    } else {
      newRequiredStandard.clear();
    }

    auto needed = this->HighestStandardNeeded(makefile, feature);

    cmValue existingStandard = currentLangStandardValue;
    if (!existingStandard) {
      cmValue defaultStandard = makefile->GetDefinition(
        cmStrCat("CMAKE_", this->Language, "_STANDARD_DEFAULT"));
      if (cmNonempty(defaultStandard)) {
        existingStandard = defaultStandard;
      }
    }

    auto existingLevelIter = cm::cend(this->Levels);
    if (existingStandard) {
      existingLevelIter =
        std::find(cm::cbegin(this->Levels), cm::cend(this->Levels),
                  ParseStd(*existingStandard));
      if (existingLevelIter == cm::cend(this->Levels)) {
        const std::string e =
          cmStrCat("The ", this->Language, "_STANDARD property on target \"",
                   targetName, "\" contained an invalid value: \"",
                   *existingStandard, "\".");
        if (error) {
          *error = e;
        } else {
          makefile->IssueMessage(MessageType::FATAL_ERROR, e);
        }
        return false;
      }
    }

    if (needed.index != -1) {
      // Ensure the C++ language level is high enough to support
      // the needed C++ features.
      if (existingLevelIter == cm::cend(this->Levels) ||
          existingLevelIter < this->Levels.begin() + needed.index) {
        newRequiredStandard = this->LevelsAsStrings[needed.index];
      }
    }

    return true;
  }